

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-parser.cc
# Opt level: O1

void __thiscall GenParser::visit(GenParser *this,Star *node)

{
  IRBuilder *this_00;
  BasicBlock *target;
  BasicBlock *iffalse;
  Temp *target_00;
  string local_50;
  
  this_00 = &this->super_IRBuilder;
  target = IR::IRBuilder::newBasicBlock(this_00);
  iffalse = IR::IRBuilder::newBasicBlock(this_00);
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  target_00 = IR::IRBuilder::newTemp(this_00,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,
                    CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                             local_50.field_2._M_local_buf[0]) + 1);
  }
  IR::IRBuilder::jump(this_00,target);
  IR::IRBuilder::place(this_00,target);
  IR::IRBuilder::save(this_00,target_00);
  CodeGenerator::condition(&this->super_CodeGenerator,(node->super_Postfix).item,target,iffalse);
  IR::IRBuilder::place(this_00,iffalse);
  IR::IRBuilder::restore(this_00,target_00);
  IR::IRBuilder::jump(this_00,(this->super_CodeGenerator).code.iftrue);
  return;
}

Assistant:

void GenParser::visit(ast::Star* node) {
  auto iftrue = newBasicBlock();
  auto iffalse = newBasicBlock();
  auto target = newTemp();

  jump(iftrue);
  place(iftrue);
  save(target);
  condition(node->item, iftrue, iffalse);
  place(iffalse);
  restore(target);
  jump(code.iftrue);
}